

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
int_writer<int,_duckdb_fmt::v6::basic_format_specs<char>_>::on_oct
          (int_writer<int,_duckdb_fmt::v6::basic_format_specs<char>_> *this)

{
  uint uVar1;
  int num_digits_00;
  basic_writer<duckdb_fmt::v6::buffer_range<char>_> *in_RDI;
  bin_writer<3> unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  format_specs in_stack_00000020;
  int num_digits;
  basic_writer<duckdb_fmt::v6::buffer_range<char>_> *this_00;
  
  this_00 = in_RDI;
  num_digits_00 = count_digits<3u,unsigned_int>(*(uint *)&in_RDI[1].out_.container);
  if (((*(char *)((long)(in_RDI->locale_).locale_ + 9) < '\0') &&
      (*(int *)((long)(in_RDI->locale_).locale_ + 4) <= num_digits_00)) &&
     (*(int *)&in_RDI[1].out_.container != 0)) {
    uVar1 = *(uint *)&in_RDI[1].locale_.locale_;
    *(uint *)&in_RDI[1].locale_.locale_ = uVar1 + 1;
    *(undefined1 *)((long)&in_RDI[1].out_.container + (ulong)uVar1 + 4) = 0x30;
  }
  get_prefix((int_writer<int,_duckdb_fmt::v6::basic_format_specs<char>_> *)0xef0f32);
  basic_writer<duckdb_fmt::v6::buffer_range<char>>::
  write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<int,duckdb_fmt::v6::basic_format_specs<char>>::bin_writer<3>>
            (this_00,num_digits_00,(string_view)in_stack_00000008,in_stack_00000020,unaff_retaddr);
  return;
}

Assistant:

void on_oct() {
      int num_digits = count_digits<3>(abs_value);
      if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<3>{abs_value, num_digits});
    }